

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdata.c
# Opt level: O3

void duckdb_je_hpdata_unreserve(hpdata_t *hpdata,void *addr,size_t sz)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  fb_group_t fVar11;
  ulong uVar12;
  
  uVar12 = (long)addr - (long)hpdata->h_address;
  uVar9 = uVar12 >> 0xc;
  uVar8 = sz >> 0xc;
  uVar1 = hpdata->h_longest_free_range;
  uVar12 = uVar12 >> 0x12;
  uVar10 = (uint)uVar9 & 0x3f;
  uVar3 = uVar10 + uVar8;
  uVar4 = 0x40 - (ulong)uVar10;
  if (uVar3 < 0x41) {
    uVar4 = uVar8;
  }
  uVar2 = uVar8 - uVar4;
  fVar11 = ~((0xffffffffffffffffU >> (-(char)uVar4 & 0x3fU)) << (sbyte)uVar10) &
           hpdata->active_pages[uVar12];
  hpdata->active_pages[uVar12] = fVar11;
  if (uVar2 < 0x41) {
    lVar6 = uVar12 + 1;
  }
  else {
    uVar4 = 0x40;
    if (uVar3 < 0x40) {
      uVar4 = uVar3;
    }
    uVar2 = (uVar3 - uVar4) - 0x41;
    uVar7 = uVar2 >> 6;
    switchD_01043a80::default(hpdata->active_pages + uVar12 + 1,0,uVar7 * 8 + 8);
    uVar2 = (uVar3 - ((uVar2 & 0xffffffffffffffc0) + uVar4)) - 0x40;
    lVar6 = uVar12 + uVar7 + 2;
  }
  if (uVar2 != 0) {
    hpdata->active_pages[lVar6] =
         hpdata->active_pages[lVar6] & ~(0xffffffffffffffffU >> (-(char)uVar2 & 0x3fU));
    fVar11 = hpdata->active_pages[uVar12];
  }
  uVar3 = (2L << (sbyte)uVar10) - 1U & fVar11;
  while (uVar3 == 0) {
    if (uVar12 == 0) {
      uVar3 = 0;
      goto LAB_01c53b1d;
    }
    uVar3 = hpdata->active_pages[uVar12 - 1];
    uVar12 = uVar12 - 1;
  }
  uVar4 = 0x3f;
  if (uVar3 != 0) {
    for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  uVar3 = (uVar12 << 6 | uVar4 ^ 0x3f) ^ 0xffffffffffffffc0;
LAB_01c53b1d:
  uVar12 = (uVar8 + uVar9) - 1;
  uVar4 = uVar12 >> 6;
  bVar5 = (byte)uVar12;
  uVar12 = (hpdata->active_pages[uVar4] >> (bVar5 & 0x3f)) << (bVar5 & 0x3f);
  do {
    if (uVar12 != 0) {
      uVar9 = 0;
      if (uVar12 != 0) {
        for (; (uVar12 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
        }
      }
      uVar9 = uVar4 << 6 | uVar9;
LAB_01c53b6a:
      if (uVar1 < uVar9 + uVar3) {
        hpdata->h_longest_free_range = uVar9 + uVar3;
      }
      hpdata->h_nactive = hpdata->h_nactive - uVar8;
      return;
    }
    if (uVar4 == 7) {
      uVar9 = 0x200;
      goto LAB_01c53b6a;
    }
    uVar12 = hpdata->active_pages[uVar4 + 1];
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void
hpdata_unreserve(hpdata_t *hpdata, void *addr, size_t sz) {
	hpdata_assert_consistent(hpdata);
	/* See the comment in reserve. */
	assert(!hpdata->h_in_psset || hpdata->h_updating);
	assert(((uintptr_t)addr & PAGE_MASK) == 0);
	assert((sz & PAGE_MASK) == 0);
	size_t begin = ((uintptr_t)addr - (uintptr_t)hpdata_addr_get(hpdata))
	    >> LG_PAGE;
	assert(begin < HUGEPAGE_PAGES);
	size_t npages = sz >> LG_PAGE;
	size_t old_longest_range = hpdata_longest_free_range_get(hpdata);

	fb_unset_range(hpdata->active_pages, HUGEPAGE_PAGES, begin, npages);
	/* We might have just created a new, larger range. */
	size_t new_begin = (fb_fls(hpdata->active_pages, HUGEPAGE_PAGES,
	    begin) + 1);
	size_t new_end = fb_ffs(hpdata->active_pages, HUGEPAGE_PAGES,
	    begin + npages - 1);
	size_t new_range_len = new_end - new_begin;

	if (new_range_len > old_longest_range) {
		hpdata_longest_free_range_set(hpdata, new_range_len);
	}

	hpdata->h_nactive -= npages;

	hpdata_assert_consistent(hpdata);
}